

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxedit.c
# Opt level: O0

WebPMuxError MuxCleanup(WebPMux *mux)

{
  WebPMuxError WVar1;
  long in_RDI;
  WebPMuxImage *frame;
  WebPMuxError err;
  int num_anim_chunks;
  int num_frames;
  WebPMux *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  WVar1 = WebPMuxNumChunks((WebPMux *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (WebPChunkId)((ulong)in_RDI >> 0x20),
                           (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (WVar1 == WEBP_MUX_OK) {
    if (in_stack_ffffffffffffffec == 1) {
      in_stack_ffffffffffffffd8 = (WebPMux *)0x0;
      WVar1 = MuxImageGetNth((WebPMuxImage **)CONCAT44(1,in_stack_ffffffffffffffe8),1,
                             (WebPMuxImage **)0x0);
      if (WVar1 != WEBP_MUX_OK) {
        return WVar1;
      }
      if ((in_stack_ffffffffffffffd8->images_ != (WebPMuxImage *)0x0) &&
         (((*(int *)(in_RDI + 0x38) == 0 && (*(int *)(in_RDI + 0x3c) == 0)) ||
          ((*(int *)&in_stack_ffffffffffffffd8->anim_ == *(int *)(in_RDI + 0x38) &&
           (*(int *)((long)&in_stack_ffffffffffffffd8->anim_ + 4) == *(int *)(in_RDI + 0x3c))))))) {
        ChunkDelete((WebPChunk *)CONCAT44(1,in_stack_ffffffffffffffe0));
        in_stack_ffffffffffffffd8->images_ = (WebPMuxImage *)0x0;
        in_stack_ffffffffffffffec = 0;
      }
    }
    WVar1 = WebPMuxNumChunks((WebPMux *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (WebPChunkId)((ulong)in_RDI >> 0x20),
                             (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if ((WVar1 == WEBP_MUX_OK) &&
       (((in_stack_ffffffffffffffe8 < 1 || (in_stack_ffffffffffffffec != 0)) ||
        (WVar1 = MuxDeleteAllNamedData(in_stack_ffffffffffffffd8,0), WVar1 == WEBP_MUX_OK)))) {
      WVar1 = WEBP_MUX_OK;
    }
  }
  return WVar1;
}

Assistant:

static WebPMuxError MuxCleanup(WebPMux* const mux) {
  int num_frames;
  int num_anim_chunks;

  // If we have an image with a single frame, and its rectangle
  // covers the whole canvas, convert it to a non-animated image
  // (to avoid writing ANMF chunk unnecessarily).
  WebPMuxError err = WebPMuxNumChunks(mux, kChunks[IDX_ANMF].id, &num_frames);
  if (err != WEBP_MUX_OK) return err;
  if (num_frames == 1) {
    WebPMuxImage* frame = NULL;
    err = MuxImageGetNth((const WebPMuxImage**)&mux->images_, 1, &frame);
    if (err != WEBP_MUX_OK) return err;
    // We know that one frame does exist.
    assert(frame != NULL);
    if (frame->header_ != NULL &&
        ((mux->canvas_width_ == 0 && mux->canvas_height_ == 0) ||
         (frame->width_ == mux->canvas_width_ &&
          frame->height_ == mux->canvas_height_))) {
      assert(frame->header_->tag_ == kChunks[IDX_ANMF].tag);
      ChunkDelete(frame->header_);  // Removes ANMF chunk.
      frame->header_ = NULL;
      num_frames = 0;
    }
  }
  // Remove ANIM chunk if this is a non-animated image.
  err = WebPMuxNumChunks(mux, kChunks[IDX_ANIM].id, &num_anim_chunks);
  if (err != WEBP_MUX_OK) return err;
  if (num_anim_chunks >= 1 && num_frames == 0) {
    err = MuxDeleteAllNamedData(mux, kChunks[IDX_ANIM].tag);
    if (err != WEBP_MUX_OK) return err;
  }
  return WEBP_MUX_OK;
}